

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArrayNew(FunctionValidator *this,ArrayNew *curr)

{
  bool bVar1;
  Module *pMVar2;
  Field local_50;
  Field *local_40;
  Field *element;
  HeapType heapType;
  Type local_28;
  Type local_20;
  ArrayNew *local_18;
  ArrayNew *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNew *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::ArrayNew*>(this,bVar1,local_18,"array.new requires gc [--enable-gc]");
  local_20.id = (local_18->size->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNew*,wasm::Type>
            (this,local_20,local_28,local_18,"array.new size must be an i32");
  heapType.id._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)63>).
                      super_Expression.type,(BasicType *)((long)&heapType.id + 4));
  if (!bVar1) {
    element = (Field *)wasm::Type::getHeapType
                                 (&(local_18->super_SpecificExpression<(wasm::Expression::Id)63>).
                                   super_Expression.type);
    bVar1 = HeapType::isArray((HeapType *)&element);
    bVar1 = shouldBeTrue<wasm::ArrayNew*>(this,bVar1,local_18,"array.new heap type must be array");
    if (bVar1) {
      HeapType::getArray((HeapType *)&local_50);
      local_40 = &local_50;
      bVar1 = ArrayNew::isWithDefault(local_18);
      if (bVar1) {
        shouldBeTrue<wasm::ArrayNew*>
                  (this,(bool)((local_18->init != (Expression *)0x0 ^ 0xffU) & 1),local_18,
                   "array.new_with_default should have no init");
        bVar1 = wasm::Type::isDefaultable(&local_40->type);
        shouldBeTrue<wasm::Field>
                  (this,bVar1,*local_40,"array.new_with_default value type must be defaultable");
      }
      else {
        shouldBeTrue<wasm::ArrayNew*>
                  (this,local_18->init != (Expression *)0x0,local_18,"array.new should have an init"
                  );
        shouldBeSubType(this,(Type)(local_18->init->type).id,(Type)(local_40->type).id,
                        (Expression *)local_18,"array.new init must have proper type");
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNew(ArrayNew* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.new requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type, Type(Type::i32), curr, "array.new size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(), curr, "array.new heap type must be array")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  if (curr->isWithDefault()) {
    shouldBeTrue(
      !curr->init, curr, "array.new_with_default should have no init");
    // The element must be defaultable.
    shouldBeTrue(element.type.isDefaultable(),
                 element,
                 "array.new_with_default value type must be defaultable");
  } else {
    shouldBeTrue(!!curr->init, curr, "array.new should have an init");
    // The inits must have the proper type.
    shouldBeSubType(curr->init->type,
                    element.type,
                    curr,
                    "array.new init must have proper type");
  }
}